

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error adios2_lock_reader_selections(adios2_engine *engine)

{
  allocator local_48 [32];
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"for adios2_engine, in call to adios2_lock_reader_selections",
             local_48);
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  adios2::core::Engine::LockReaderSelections();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_lock_reader_selections(adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(
            engine, "for adios2_engine, in call to adios2_lock_reader_selections");
        reinterpret_cast<adios2::core::Engine *>(engine)->LockReaderSelections();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_engine_type"));
    }
}